

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,char *rhs)

{
  pointer *ppcVar1;
  iterator __position;
  size_t __n;
  
  __n = strlen(rhs);
  std::vector<char,_std::allocator<char>_>::reserve(lhs,__n);
  for (; __n != 0; __n = __n - 1) {
    __position._M_current =
         (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)lhs,__position,rhs);
    }
    else {
      *__position._M_current = *rhs;
      ppcVar1 = &(lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    rhs = rhs + 1;
  }
  return lhs;
}

Assistant:

std::vector<char>& cnpy::operator+=(std::vector<char>& lhs, const char* rhs) {
    //write in little endian
    size_t len = strlen(rhs);
    lhs.reserve(len);
    for(size_t byte = 0; byte < len; byte++) {
        lhs.push_back(rhs[byte]);
    }
    return lhs;
}